

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::AliasingBarrier
          (DeviceContextVkImpl *this,IDeviceObject *pResourceBefore,IDeviceObject *pResourceAfter)

{
  BIND_FLAGS BVar1;
  VkAccessFlags local_34;
  VkPipelineStageFlags local_30;
  VkAccessFlags vkDstAccessMask;
  VkPipelineStageFlags vkDstStages;
  VkAccessFlags vkSrcAccessMask;
  VkPipelineStageFlags vkSrcStages;
  anon_class_1_0_00000001 GetResourceBindFlags;
  IDeviceObject *pResourceAfter_local;
  IDeviceObject *pResourceBefore_local;
  DeviceContextVkImpl *this_local;
  
  vkDstStages = 0;
  vkDstAccessMask = 0;
  _vkSrcStages = pResourceAfter;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&vkSrcAccessMask + 3),pResourceBefore);
  GetAllowedStagesAndAccessMask(BVar1,&vkDstStages,&vkDstAccessMask);
  local_30 = 0;
  local_34 = 0;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&vkSrcAccessMask + 3),_vkSrcStages);
  GetAllowedStagesAndAccessMask(BVar1,&local_30,&local_34);
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
            (&this->m_CommandBuffer,vkDstAccessMask,local_34,vkDstStages,local_30);
  return;
}

Assistant:

void DeviceContextVkImpl::AliasingBarrier(IDeviceObject* pResourceBefore, IDeviceObject* pResourceAfter)
{
    auto GetResourceBindFlags = [](IDeviceObject* pResource) //
    {
        if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
        {
            return pTexture.RawPtr<TextureVkImpl>()->GetDesc().BindFlags;
        }
        else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
        {
            return pBuffer.RawPtr<BufferVkImpl>()->GetDesc().BindFlags;
        }
        else
        {
            constexpr BIND_FLAGS BindAll = static_cast<BIND_FLAGS>((Uint32{BIND_FLAG_LAST} << 1) - 1);
            return BindAll;
        }
    };

    VkPipelineStageFlags vkSrcStages     = 0;
    VkAccessFlags        vkSrcAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceBefore), vkSrcStages, vkSrcAccessMask);

    VkPipelineStageFlags vkDstStages     = 0;
    VkAccessFlags        vkDstAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceAfter), vkDstStages, vkDstAccessMask);

    EnsureVkCmdBuffer();
    m_CommandBuffer.MemoryBarrier(vkSrcAccessMask, vkDstAccessMask, vkSrcStages, vkDstStages);
}